

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fltstrip.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool_t bVar1;
  bfile_t *pbVar2;
  undefined8 *in_RSI;
  int in_EDI;
  prf_nodeinfo_t *info;
  int i;
  bfile_t *bfile;
  prf_model_t *model;
  char *in_stack_00000060;
  uint16_t in_stack_ffffffffffffffce;
  prf_nodeinfo_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  int local_4;
  
  if (in_EDI < 4) {
    printf("Usage: %s <inputfile> <outputfile> <opcode> [<opcode> ...]\n",*in_RSI);
    local_4 = -1;
  }
  else {
    pbVar2 = bf_create_r(in_stack_00000060);
    if (pbVar2 == (bfile_t *)0x0) {
      printf("Error: Could not open \'%s\' for loading.\n",in_RSI[1]);
      local_4 = -1;
    }
    else {
      prf_init();
      prf_model_create();
      prf_model_poolmem((prf_model_t *)0x102357);
      bVar1 = prf_model_load((prf_model_t *)pbVar2,
                             (bfile_t *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (bVar1 == 0) {
        printf("Error: Couldn\'t parse model.\n");
        bf_destroy((bfile_t *)0x102383);
        prf_exit();
        local_4 = -1;
      }
      else {
        bf_destroy((bfile_t *)0x10239f);
        for (iVar3 = 3; iVar3 < in_EDI; iVar3 = iVar3 + 1) {
          atoi((char *)in_RSI[iVar3]);
          in_stack_ffffffffffffffd0 = prf_nodeinfo_get(in_stack_ffffffffffffffce);
          if (in_stack_ffffffffffffffd0 == (prf_nodeinfo_t *)0x0) {
            fprintf(_stderr,"Warning: couldn\'t find nodeinfo for \'%s\'\n",in_RSI[iVar3]);
          }
          else {
            in_stack_ffffffffffffffd0->save_f = dont_save;
          }
        }
        pbVar2 = bf_create_w((char *)in_stack_ffffffffffffffd0);
        if (pbVar2 == (bfile_t *)0x0) {
          printf("Error: Could not open \'%s\' for writing.\n",in_RSI[2]);
          prf_model_destroy((prf_model_t *)in_stack_ffffffffffffffd0);
          prf_exit();
          local_4 = -1;
        }
        else {
          prf_model_save((prf_model_t *)pbVar2,(bfile_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8))
          ;
          bf_destroy((bfile_t *)0x102484);
          prf_model_destroy((prf_model_t *)in_stack_ffffffffffffffd0);
          prf_exit();
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv )
{
  prf_model_t * model;
  bfile_t * bfile;
  int i;

  if ( argc <= 3 ) {
    printf( "Usage: %s <inputfile> <outputfile> <opcode> [<opcode> ...]\n",
      argv[0] );
    return -1;
  }

  bfile = bf_create_r( argv[1] );
  if ( ! bfile ) {
    printf( "Error: Could not open '%s' for loading.\n", argv[1] );
    return -1;
  }

  prf_init();

  model = prf_model_create();
  assert( model != NULL );
  prf_model_poolmem( model );

  if ( ! prf_model_load( model, bfile ) ) {
    printf( "Error: Couldn't parse model.\n" );
    bf_destroy( bfile );
    prf_exit();
    return -1;
  }
  bf_destroy( bfile );

  for ( i = 3; i < argc; i++ ) {
    prf_nodeinfo_t * info;
    info = prf_nodeinfo_get( atoi( argv[i] ) );
    if ( ! info ) {
      fprintf( stderr, "Warning: couldn't find nodeinfo for '%s'\n",
        argv[i] );
    } else {
      info->save_f = dont_save;
    }
  }

  bfile = bf_create_w( argv[2] );
  if ( ! bfile ) {
    printf( "Error: Could not open '%s' for writing.\n", argv[2] );
    prf_model_destroy( model );
    prf_exit();
    return -1;
  }
  prf_model_save( model, bfile );

  bf_destroy( bfile );
  prf_model_destroy( model );

  prf_exit();

  return 0;
}